

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateRecyclerAllocAligned
          (Lowerer *this,JnHelperMethod allocHelper,size_t allocSize,RegOpnd *newObjDst,
          Instr *insertionPointInstr,bool inOpHelper)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  LabelInstr *allocHelperLabel_00;
  Opnd *opndArg;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  Instr *newObjCall;
  LabelInstr *allocHelperLabel;
  LabelInstr *allocDoneLabel;
  bool inOpHelper_local;
  Instr *insertionPointInstr_local;
  RegOpnd *newObjDst_local;
  size_t allocSize_local;
  JnHelperMethod allocHelper_local;
  Lowerer *this_local;
  
  allocHelperLabel = (LabelInstr *)0x0;
  sourceContextId = Func::GetSourceContextId(insertionPointInstr->m_func);
  functionId = Func::GetLocalFunctionId(insertionPointInstr->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,JitAllocNewObjPhase,sourceContextId,functionId);
  if ((!bVar1) && (bVar1 = Memory::HeapInfo::IsSmallObject(allocSize), bVar1)) {
    allocHelperLabel_00 = IR::LabelInstr::New(Label,this->m_func,true);
    allocHelperLabel = IR::LabelInstr::New(Label,this->m_func,inOpHelper);
    LowererMD::GenerateFastRecyclerAlloc
              (&this->m_lowererMD,allocSize,newObjDst,insertionPointInstr,allocHelperLabel_00,
               allocHelperLabel);
    IR::Instr::InsertBefore(insertionPointInstr,&allocHelperLabel_00->super_Instr);
  }
  opndArg = LoadScriptContextValueOpnd(this,insertionPointInstr,ScriptContextRecycler);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertionPointInstr,opndArg);
  opndArg_00 = IR::IntConstOpnd::New((long)(int)allocSize,TyUint32,this->m_func,true);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertionPointInstr,&opndArg_00->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(allocHelper,this->m_func);
  instr = IR::Instr::New(Call,&newObjDst->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertionPointInstr,instr);
  LowererMD::LowerCall(&this->m_lowererMD,instr,0);
  if (allocHelperLabel != (LabelInstr *)0x0) {
    IR::Instr::InsertBefore(insertionPointInstr,&allocHelperLabel->super_Instr);
  }
  return;
}

Assistant:

void
Lowerer::GenerateRecyclerAllocAligned(IR::JnHelperMethod allocHelper, size_t allocSize, IR::RegOpnd* newObjDst, IR::Instr* insertionPointInstr, bool inOpHelper)
{
    IR::LabelInstr * allocDoneLabel = nullptr;

    if (!PHASE_OFF(Js::JitAllocNewObjPhase, insertionPointInstr->m_func) && HeapInfo::IsSmallObject(allocSize))
    {
        IR::LabelInstr * allocHelperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        allocDoneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, inOpHelper);

        this->m_lowererMD.GenerateFastRecyclerAlloc(allocSize, newObjDst, insertionPointInstr, allocHelperLabel, allocDoneLabel);

        // $allocHelper:
        insertionPointInstr->InsertBefore(allocHelperLabel);
    }

    // call JavascriptOperators::AllocMemForScObject(allocSize, scriptContext->GetRecycler())
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, this->LoadScriptContextValueOpnd(insertionPointInstr, ScriptContextValue::ScriptContextRecycler));
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, IR::IntConstOpnd::New((int32)allocSize, TyUint32, m_func, true));
    IR::Instr *newObjCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(allocHelper, m_func), m_func);
    insertionPointInstr->InsertBefore(newObjCall);
    this->m_lowererMD.LowerCall(newObjCall, 0);

    if (allocDoneLabel != nullptr)
    {
        // $allocDone:
        insertionPointInstr->InsertBefore(allocDoneLabel);
    }
}